

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstream.cpp
# Opt level: O0

void __thiscall string_stream_to_string_Test::TestBody(string_stream_to_string_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_318;
  Message local_310;
  string local_308;
  string local_2e8;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_1;
  string_stream ss2;
  Message local_198;
  string local_190;
  string local_170;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  undefined1 local_130 [8];
  string_stream ss;
  char latin1 [5];
  string_stream_to_string_Test *this_local;
  
  ss.m_stack[0xfc] = '\0';
  ss.m_stack[0xf8] = ' ';
  ss.m_stack[0xf9] = '~';
  ss.m_stack[0xfa] = -0x60;
  ss.m_stack[0xfb] = -1;
  ST::string_stream::string_stream((string_stream *)local_130);
  ST::string_stream::append((string_stream *)local_130,ss.m_stack + 0xf8,0xffffffffffffffff);
  ST::string::from_latin_1(&local_170,ss.m_stack + 0xf8,0xffffffffffffffff);
  ST::string_stream::to_string(&local_190,(string_stream *)local_130,false,check_validity);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_150,"ST::string::from_latin_1(latin1)","ss.to_string(false)",
             &local_170,&local_190);
  ST::string::~string(&local_190);
  ST::string::~string(&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(ss2.m_stack + 0xf8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(ss2.m_stack + 0xf8),&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(ss2.m_stack + 0xf8));
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  ST::string_stream::string_stream((string_stream *)&gtest_ar_1.message_);
  ST::string_stream::append
            ((string_stream *)&gtest_ar_1.message_,TestBody::utf8_test_data,0xffffffffffffffff);
  ST::string::from_utf8(&local_2e8,TestBody::utf8_test_data,0xffffffffffffffff,check_validity);
  ST::string_stream::to_string(&local_308,(string_stream *)&gtest_ar_1.message_,true,check_validity)
  ;
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_2c8,"ST::string::from_utf8(utf8_test_data)","ss2.to_string(true)",
             &local_2e8,&local_308);
  ST::string::~string(&local_308);
  ST::string::~string(&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  ST::string_stream::~string_stream((string_stream *)&gtest_ar_1.message_);
  ST::string_stream::~string_stream((string_stream *)local_130);
  return;
}

Assistant:

TEST(string_stream, to_string)
{
    const char latin1[] = "\x20\x7e\xa0\xff";
    static const char utf8_test_data[] =
        "\x20"              "\x7f"
        "\xc3\xbf"          "\xc4\x80"
        "\xe7\xbf\xbf"
        "\xef\xbf\xbf"      "\xf0\x90\x80\x80"
        "\xf0\x90\x80\xa0"  "\xf1\x80\x80\x80"
        "\xf4\x8f\xbf\xbf";

    ST::string_stream ss;
    ss.append(latin1);
    EXPECT_EQ(ST::string::from_latin_1(latin1), ss.to_string(false));

    ST::string_stream ss2;
    ss2.append(utf8_test_data);
    EXPECT_EQ(ST::string::from_utf8(utf8_test_data), ss2.to_string(true));
}